

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringInternalCache_allocatingMoreThanCacheAvailable_TestShell::
~TEST_SimpleStringInternalCache_allocatingMoreThanCacheAvailable_TestShell
          (TEST_SimpleStringInternalCache_allocatingMoreThanCacheAvailable_TestShell *this)

{
  TEST_SimpleStringInternalCache_allocatingMoreThanCacheAvailable_TestShell *this_local;
  
  ~TEST_SimpleStringInternalCache_allocatingMoreThanCacheAvailable_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, allocatingMoreThanCacheAvailable)
{
    createCacheForSize(10, 1);
    cache.setAllocator(allocator);

    cache.alloc(10);
    cache.alloc(10);

    cache.setAllocator(allocator->originalAllocator());

    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(32));
    CHECK(!cache.hasFreeBlocksOfSize(10));

    cache.setAllocator(allocator);
}